

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

lys_module * ly_ctx_get_module_by(ly_ctx *ctx,char *key,int offset,char *revision,int with_disabled)

{
  int iVar1;
  LY_ERR *pLVar2;
  ly_ctx *local_40;
  lys_module *result;
  int i;
  int with_disabled_local;
  char *revision_local;
  int offset_local;
  char *key_local;
  ly_ctx *ctx_local;
  
  local_40 = (ly_ctx *)0x0;
  if ((ctx == (ly_ctx *)0x0) || (key == (char *)0x0)) {
    pLVar2 = ly_errno_location();
    *pLVar2 = LY_EINVAL;
    ctx_local = (ly_ctx *)0x0;
  }
  else {
    for (result._0_4_ = 0; (int)result < (ctx->models).used; result._0_4_ = (int)result + 1) {
      if ((((with_disabled != 0) ||
           (((byte)(ctx->models).list[(int)result]->field_0x40 >> 6 & 1) == 0)) &&
          ((ctx->models).list[(int)result] != (lys_module *)0x0)) &&
         (iVar1 = strcmp(key,*(char **)((long)&(ctx->models).list[(int)result]->ctx + (long)offset))
         , iVar1 == 0)) {
        if (revision == (char *)0x0) {
          if ((local_40 == (ly_ctx *)0x0) ||
             (((ctx->models).list[(int)result]->rev_size != '\0' &&
              (((local_40->dict).recs[2].field_0x11 == '\0' ||
               (iVar1 = strcmp((ctx->models).list[(int)result]->rev->date,
                               (char *)(local_40->dict).recs[3].value), -1 < iVar1)))))) {
            local_40 = (ly_ctx *)(ctx->models).list[(int)result];
          }
        }
        else if (((ctx->models).list[(int)result]->rev_size != '\0') &&
                (iVar1 = strcmp(revision,(ctx->models).list[(int)result]->rev->date), iVar1 == 0)) {
          local_40 = (ly_ctx *)(ctx->models).list[(int)result];
          break;
        }
      }
    }
    ctx_local = local_40;
  }
  return (lys_module *)ctx_local;
}

Assistant:

static const struct lys_module *
ly_ctx_get_module_by(const struct ly_ctx *ctx, const char *key, int offset, const char *revision, int with_disabled)
{
    int i;
    struct lys_module *result = NULL;

    if (!ctx || !key) {
        ly_errno = LY_EINVAL;
        return NULL;
    }

    for (i = 0; i < ctx->models.used; i++) {
        if (!with_disabled && ctx->models.list[i]->disabled) {
            /* skip the disabled modules */
            continue;
        }
        /* use offset to get address of the pointer to string (char**), remember that offset is in
         * bytes, so we have to cast the pointer to the module to (char*), finally, we want to have
         * string not the pointer to string
         */
        if (!ctx->models.list[i] || strcmp(key, *(char**)(((char*)ctx->models.list[i]) + offset))) {
            continue;
        }

        if (!revision) {
            /* compare revisons and remember the newest one */
            if (result) {
                if (!ctx->models.list[i]->rev_size) {
                    /* the current have no revision, keep the previous with some revision */
                    continue;
                }
                if (result->rev_size && strcmp(ctx->models.list[i]->rev[0].date, result->rev[0].date) < 0) {
                    /* the previous found matching module has a newer revision */
                    continue;
                }
            }

            /* remember the current match and search for newer version */
            result = ctx->models.list[i];
        } else {
            if (ctx->models.list[i]->rev_size && !strcmp(revision, ctx->models.list[i]->rev[0].date)) {
                /* matching revision */
                result = ctx->models.list[i];
                break;
            }
        }
    }

    return result;

}